

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cloud_cover.cpp
# Opt level: O0

void randomDistPoint(int dim,int *topologies,ANNpoint *p)

{
  int iVar1;
  int iVar2;
  long *in_RDX;
  long in_RSI;
  int in_EDI;
  double dVar3;
  double dVar4;
  double __x;
  double dVar5;
  double dVar6;
  double r2;
  double r1;
  double Theta2;
  double Theta1;
  double tmp2;
  double tmp1;
  double tmp;
  int kk;
  undefined4 local_1c;
  
  for (local_1c = 0; local_1c < in_EDI; local_1c = local_1c + 1) {
    iVar1 = rand();
    dVar3 = (double)iVar1 / 2147830000.0;
    if (*(int *)(in_RSI + (long)local_1c * 4) == 2) {
      *(double *)(*in_RDX + (long)local_1c * 8) = dVar3 * 6.283185307179586 + -3.141592653589793;
    }
    else if (*(int *)(in_RSI + (long)local_1c * 4) == 3) {
      iVar1 = rand();
      iVar2 = rand();
      dVar4 = ((double)iVar1 / 2147830000.0) * 6.283185307179586;
      __x = ((double)iVar2 / 2147830000.0) * 3.141592653589793 + -1.5707963267948966;
      dVar5 = sqrt(1.0 - dVar3);
      dVar3 = sqrt(dVar3);
      dVar6 = sin(dVar4);
      *(double *)(*in_RDX + (long)local_1c * 8) = dVar6 * dVar5;
      dVar4 = cos(dVar4);
      *(double *)(*in_RDX + (long)(local_1c + 1) * 8) = dVar4 * dVar5;
      dVar4 = sin(__x);
      *(double *)(*in_RDX + (long)(local_1c + 2) * 8) = dVar4 * dVar3;
      dVar4 = cos(__x);
      *(double *)(*in_RDX + (long)(local_1c + 3) * 8) = dVar4 * dVar3;
      local_1c = local_1c + 3;
    }
    else {
      *(double *)(*in_RDX + (long)local_1c * 8) = dVar3 * 200.0 + -100.0;
    }
  }
  return;
}

Assistant:

void randomDistPoint(int dim, const int *topologies, ANNpoint &p) {
    for (int kk = 0; kk < dim; kk++) {
        double tmp = rand() / (2.14783e+09);
        if (topologies[kk] == 2) {
            p[kk] = (2 * PI * tmp - PI);  // region -PI PI
        } else if (topologies[kk] == 3) {
            double tmp1 = rand() / (2.14783e+09);
            double tmp2 = rand() / (2.14783e+09);

            double Theta1 = 2 * PI * tmp1;
            double Theta2 = PI * tmp2 - PI / 2;
            double r1 = sqrt(1 - tmp);
            double r2 = sqrt(tmp);

            p[kk] = sin(Theta1) * r1;
            p[kk + 1] = cos(Theta1) * r1;
            p[kk + 2] = sin(Theta2) * r2;
            p[kk + 3] = cos(Theta2) * r2;

            // Modifies loop index!
            kk = kk + 3;  // random quaternions
        } else
            p[kk] = 200 * tmp - 100;  // region -100 to 100
    }
}